

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5FmaAccuracy.cpp
# Opt level: O1

void __thiscall
glcts::GPUShader5FmaAccuracyTest::GPUShader5FmaAccuracyTest
          (GPUShader5FmaAccuracyTest *this,Context *context,ExtParameters *extParams,char *name,
          char *description)

{
  TestCaseBase::TestCaseBase(&this->super_TestCaseBase,context,extParams,name,description);
  (this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCaseBase_02158170;
  this->m_fragment_shader_id = 0;
  this->m_program_object_id_for_float_pass = 0;
  this->m_program_object_id_for_fma_pass = 0;
  this->m_vertex_shader_id_for_float_pass = 0;
  this->m_vertex_shader_id_for_float_pass = 0;
  this->m_vertex_shader_id_for_fma_pass = 0;
  this->m_buffer_object_id = 0;
  this->m_vertex_array_object_id = 0;
  return;
}

Assistant:

GPUShader5FmaAccuracyTest::GPUShader5FmaAccuracyTest(Context& context, const ExtParameters& extParams, const char* name,
													 const char* description)
	: TestCaseBase(context, extParams, name, description)
	, m_fragment_shader_id(0)
	, m_program_object_id_for_float_pass(0)
	, m_program_object_id_for_fma_pass(0)
	, m_vertex_shader_id_for_float_pass(0)
	, m_vertex_shader_id_for_fma_pass(0)
	, m_buffer_object_id(0)
	, m_vertex_array_object_id(0)
{
	/* Nothing to be done here */
}